

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O2

void miSubtractNonO1(QRegionPrivate *dest,QRect *r,QRect *rEnd,int y1,int y2)

{
  QList<QRect> *this;
  int iVar1;
  long lVar2;
  pointer pQVar3;
  int iVar4;
  ulong uVar5;
  
  this = &dest->rects;
  pQVar3 = QList<QRect>::data(this);
  uVar5 = (ulong)dest->numRects;
  pQVar3 = pQVar3 + uVar5;
  for (; iVar4 = (int)uVar5, r != rEnd; r = r + 1) {
    lVar2 = (dest->rects).d.size;
    if (lVar2 + -1 <= (long)iVar4) {
      QList<QRect>::resize(this,lVar2 * 2);
      pQVar3 = QList<QRect>::data(this);
      iVar4 = dest->numRects;
      pQVar3 = pQVar3 + iVar4;
    }
    iVar1 = (r->x2).m_i;
    (pQVar3->x1).m_i = (r->x1).m_i;
    (pQVar3->y1).m_i = y1;
    (pQVar3->x2).m_i = iVar1;
    (pQVar3->y2).m_i = y2;
    uVar5 = (ulong)(iVar4 + 1U);
    dest->numRects = iVar4 + 1U;
    pQVar3 = pQVar3 + 1;
  }
  return;
}

Assistant:

static void miSubtractNonO1(QRegionPrivate &dest, const QRect *r,
                            const QRect *rEnd, int y1, int y2)
{
    QRect *pNextRect;

    pNextRect = dest.rects.data() + dest.numRects;

    Q_ASSERT(y1<=y2);

    while (r != rEnd) {
        Q_ASSERT(r->left() <= r->right());
        MEMCHECK(dest, pNextRect, dest.rects)
        pNextRect->setCoords(r->left(), y1, r->right(), y2);
        ++dest.numRects;
        ++pNextRect;
        ++r;
    }
}